

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O1

char * scanf_fmtstr(char *src,char *type)

{
  ushort *puVar1;
  int iVar2;
  ushort **ppuVar3;
  char *pcVar4;
  char cVar5;
  char *pcVar6;
  int rd;
  char i32 [6];
  int local_3c;
  char local_38 [8];
  
  cVar5 = *src;
  pcVar6 = src;
  if (cVar5 != '\0') {
    ppuVar3 = __ctype_b_loc();
    puVar1 = *ppuVar3;
    do {
      if ((((puVar1[cVar5] >> 0xd & 1) != 0) || (cVar5 == ')')) || (cVar5 == ']')) break;
      iVar2 = strncmp(pcVar6,"...",3);
      if (iVar2 == 0) break;
      cVar5 = pcVar6[1];
      pcVar6 = pcVar6 + 1;
    } while (cVar5 != '\0');
  }
  iVar2 = (int)pcVar6 - (int)src;
  builtin_strncpy(local_38,"%*i%n",6);
  local_3c = 0;
  pcVar6 = (char *)0x0;
  __isoc99_sscanf(src,"%*lih%n",&local_3c);
  if (local_3c == iVar2) {
    pcVar6 = "%*lih%n";
  }
  if ((type != (char *)0x0) && (local_3c == iVar2)) {
    *type = 'h';
    pcVar6 = "%*lih%n";
  }
  if (pcVar6 == (char *)0x0) {
    local_3c = 0;
    pcVar6 = (char *)0x0;
    __isoc99_sscanf(src,"%*d%n",&local_3c);
    if (local_3c == iVar2) {
      pcVar6 = "%*d%n";
    }
    if ((type != (char *)0x0) && (local_3c == iVar2)) {
      *type = 'i';
      pcVar6 = "%*d%n";
    }
    if (pcVar6 == (char *)0x0) {
      local_3c = 0;
      pcVar6 = (char *)0x0;
      __isoc99_sscanf(src,"%*ii%n",&local_3c);
      if (local_3c == iVar2) {
        pcVar6 = "%*ii%n";
      }
      if ((type != (char *)0x0) && (local_3c == iVar2)) {
        *type = 'i';
        pcVar6 = "%*ii%n";
      }
      if (pcVar6 == (char *)0x0) {
        local_3c = 0;
        __isoc99_sscanf(src,local_38,&local_3c);
        pcVar6 = (char *)0x0;
        if (local_3c == iVar2) {
          pcVar6 = local_38;
        }
        if ((type != (char *)0x0) && (local_3c == iVar2)) {
          *type = 'i';
          pcVar6 = local_38;
        }
        if (pcVar6 == (char *)0x0) {
          local_3c = 0;
          pcVar6 = (char *)0x0;
          __isoc99_sscanf(src,"%*lfd%n",&local_3c);
          if (local_3c == iVar2) {
            pcVar6 = "%*lfd%n";
          }
          if ((type != (char *)0x0) && (local_3c == iVar2)) {
            *type = 'd';
            pcVar6 = "%*lfd%n";
          }
          if (pcVar6 == (char *)0x0) {
            local_3c = 0;
            pcVar6 = (char *)0x0;
            __isoc99_sscanf(src,"%*ff%n",&local_3c);
            if (local_3c == iVar2) {
              pcVar6 = "%*ff%n";
            }
            if ((type != (char *)0x0) && (local_3c == iVar2)) {
              *type = 'f';
              pcVar6 = "%*ff%n";
            }
            if (pcVar6 == (char *)0x0) {
              local_3c = 0;
              pcVar6 = (char *)0x0;
              __isoc99_sscanf(src,"%*f%n",&local_3c);
              if (local_3c == iVar2) {
                pcVar6 = "%*f%n";
              }
              if ((type != (char *)0x0) && (local_3c == iVar2)) {
                *type = 'f';
                pcVar6 = "%*f%n";
              }
            }
          }
        }
      }
    }
  }
  pcVar4 = "%*x%n";
  if (pcVar6 != local_38) {
    pcVar4 = pcVar6;
  }
  return pcVar4;
}

Assistant:

static const char* scanf_fmtstr(const char* src, char* type)
{
    const char* end = src;
    // skip to string end, word end or a closing parenthesis
    for(; *end && !isspace(*end) && (*end != ')') && (*end != ']')
               && strncmp(end, "...", 3); ++end);

    int exp = end - src;

    // store type byte in the parameter, or in a temporary variable?
    char tmp;
    char* _type = type ? type : &tmp;

    const char i32[] = "%*"PRIi32"%n";

    const char* r; // result
    int ok = (r = try_fmt(src, exp, "%*"PRIi64"h%n", _type, 'h'))
          || (r = try_fmt(src, exp, "%*d%n", _type, 'i'))
          || (r = try_fmt(src, exp, "%*"PRIi32"i%n", _type, 'i'))
          || (r = try_fmt(src, exp, i32, _type, 'i'))
          || (r = try_fmt(src, exp, "%*lfd%n", _type, 'd'))
          || (r = try_fmt(src, exp, "%*ff%n", _type, 'f'))
          || (r = try_fmt(src, exp, "%*f%n", _type, 'f'));
    (void)ok;
    if(r == i32)
        r = "%*x%n";
    return r;
}